

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_avx2_256_8.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_scan_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  __m256i *palVar2;
  unkbyte9 *pVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  uint uVar7;
  void *pvVar8;
  parasail_matrix_t *ppVar9;
  void *pvVar10;
  void *pvVar11;
  bool bVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  int iVar30;
  char cVar31;
  byte bVar32;
  char cVar33;
  int8_t iVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  parasail_result_t *ppVar38;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int8_t *ptr_06;
  int iVar39;
  long lVar40;
  uint uVar41;
  uint uVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  int iVar49;
  long lVar50;
  int32_t segNum;
  long lVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  undefined1 uVar55;
  char cVar56;
  undefined1 uVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  char cVar66;
  undefined1 auVar65 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  byte bVar70;
  undefined1 auVar69 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  __m256i_8_t h;
  undefined1 in_stack_fffffffffffffbc0 [20];
  undefined4 uVar75;
  int local_418;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_2a0 [32];
  undefined1 uStack_277;
  undefined1 uStack_276;
  undefined1 uStack_275;
  undefined1 uStack_274;
  undefined1 uStack_273;
  undefined1 uStack_272;
  undefined1 uStack_271;
  undefined1 uStack_270;
  undefined1 uStack_26f;
  undefined1 uStack_26e;
  undefined1 uStack_26d;
  undefined1 uStack_26c;
  undefined1 uStack_26b;
  undefined1 uStack_26a;
  undefined1 uStack_269;
  undefined1 uStack_268;
  undefined1 uStack_267;
  undefined1 uStack_266;
  undefined1 uStack_265;
  undefined1 uStack_264;
  undefined1 uStack_263;
  undefined1 uStack_262;
  undefined1 uStack_261;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  local_360._0_4_ = s1_beg;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar8 = (profile->profile8).score;
    if (pvVar8 == (void *)0x0) {
      parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar9 = profile->matrix;
      if (ppVar9 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_6();
      }
      else {
        uVar7 = profile->s1Len;
        if ((int)uVar7 < 1) {
          parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_8_cold_1();
        }
        else {
          iVar43 = uVar7 - 1;
          uVar54 = (ulong)uVar7 + 0x1f >> 5;
          uVar53 = (uint)uVar54;
          iVar35 = iVar43 / (int)uVar53;
          uVar52 = iVar43 % (int)uVar53;
          iVar36 = ppVar9->min;
          pvVar10 = (profile->profile8).matches;
          iVar44 = -open;
          local_2a0._0_4_ = iVar44;
          uVar37 = (uint)(byte)-(char)iVar36;
          if (iVar36 != iVar44 && SBORROW4(iVar36,iVar44) == iVar36 + open < 0) {
            uVar37 = open;
          }
          pvVar11 = (profile->profile8).similar;
          cVar31 = '~' - (char)ppVar9->max;
          ppVar38 = parasail_result_new_stats();
          if (ppVar38 != (parasail_result_t *)0x0) {
            ppVar38->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar38->flag | 0x20110402;
            b = parasail_memalign___m256i(0x20,uVar54);
            b_00 = parasail_memalign___m256i(0x20,uVar54);
            b_01 = parasail_memalign___m256i(0x20,uVar54);
            b_02 = parasail_memalign___m256i(0x20,uVar54);
            local_340._0_8_ = CONCAT44(0,s2Len);
            ptr = parasail_memalign___m256i(0x20,uVar54);
            b_03 = parasail_memalign___m256i(0x20,uVar54);
            uVar75 = 0;
            b_04 = parasail_memalign___m256i(0x20,uVar54);
            b_05 = parasail_memalign___m256i(0x20,uVar54);
            ptr_00 = parasail_memalign___m256i(0x20,CONCAT44(uVar75,uVar53));
            ptr_01 = parasail_memalign___m256i(0x20,CONCAT44(uVar75,uVar53));
            ptr_02 = parasail_memalign___m256i(0x20,CONCAT44(uVar75,uVar53));
            ptr_03 = parasail_memalign___m256i(0x20,CONCAT44(uVar75,uVar53));
            ptr_04 = parasail_memalign___m256i(0x20,CONCAT44(uVar75,uVar53));
            ptr_05 = parasail_memalign___m256i(0x20,CONCAT44(uVar75,uVar53));
            ptr_06 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_06 != (int8_t *)0x0 &&
                (ptr_05 != (__m256i *)0x0 && (ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0))
                ) && ((ptr_02 != (__m256i *)0x0 &&
                      (ptr_01 != (__m256i *)0x0 &&
                      (ptr_00 != (__m256i *)0x0 && b_05 != (__m256i *)0x0))) &&
                     ((b_04 != (__m256i *)0x0 && (b_03 != (__m256i *)0x0 && ptr != (__m256i *)0x0))
                     && ((b_02 != (__m256i *)0x0 && b_01 != (__m256i *)0x0) &&
                        (b_00 != (__m256i *)0x0 && b != (__m256i *)0x0))))) {
              iVar36 = s2Len + -1;
              iVar39 = 0x1f - iVar35;
              uVar55 = (undefined1)open;
              cVar56 = (char)gap;
              bVar32 = (char)uVar37 + 0x81;
              uVar37 = CONCAT31((int3)(uVar37 >> 8),bVar32);
              uVar57 = (undefined1)iVar39;
              auVar58[0] = (char)uVar53;
              auVar58[1] = auVar58[0];
              auVar58[2] = auVar58[0];
              auVar58[3] = auVar58[0];
              auVar58[4] = auVar58[0];
              auVar58[5] = auVar58[0];
              auVar58[6] = auVar58[0];
              auVar58[7] = auVar58[0];
              auVar58[8] = auVar58[0];
              auVar58[9] = auVar58[0];
              auVar58[10] = auVar58[0];
              auVar58[0xb] = auVar58[0];
              auVar58[0xc] = auVar58[0];
              auVar58[0xd] = auVar58[0];
              auVar58[0xe] = auVar58[0];
              auVar58[0xf] = auVar58[0];
              auVar58[0x10] = auVar58[0];
              auVar58[0x11] = auVar58[0];
              auVar58[0x12] = auVar58[0];
              auVar58[0x13] = auVar58[0];
              auVar58[0x14] = auVar58[0];
              auVar58[0x15] = auVar58[0];
              auVar58[0x16] = auVar58[0];
              auVar58[0x17] = auVar58[0];
              auVar58[0x18] = auVar58[0];
              auVar58[0x19] = auVar58[0];
              auVar58[0x1a] = auVar58[0];
              auVar58[0x1b] = auVar58[0];
              auVar58[0x1c] = auVar58[0];
              auVar58[0x1d] = auVar58[0];
              auVar58[0x1e] = auVar58[0];
              auVar58[0x1f] = auVar58[0];
              auVar24 = vpmovsxwq_avx2(ZEXT816(0xffffffffffffff00));
              auVar17 = vpand_avx2(auVar58,auVar24);
              cVar33 = -(auVar58[0] * cVar56);
              auVar59[1] = cVar33;
              auVar59[0] = cVar33;
              auVar59[2] = cVar33;
              auVar59[3] = cVar33;
              auVar59[4] = cVar33;
              auVar59[5] = cVar33;
              auVar59[6] = cVar33;
              auVar59[7] = cVar33;
              auVar59[8] = cVar33;
              auVar59[9] = cVar33;
              auVar59[10] = cVar33;
              auVar59[0xb] = cVar33;
              auVar59[0xc] = cVar33;
              auVar59[0xd] = cVar33;
              auVar59[0xe] = cVar33;
              auVar59[0xf] = cVar33;
              auVar59[0x10] = cVar33;
              auVar59[0x11] = cVar33;
              auVar59[0x12] = cVar33;
              auVar59[0x13] = cVar33;
              auVar59[0x14] = cVar33;
              auVar59[0x15] = cVar33;
              auVar59[0x16] = cVar33;
              auVar59[0x17] = cVar33;
              auVar59[0x18] = cVar33;
              auVar59[0x19] = cVar33;
              auVar59[0x1a] = cVar33;
              auVar59[0x1b] = cVar33;
              auVar59[0x1c] = cVar33;
              auVar59[0x1d] = cVar33;
              auVar59[0x1e] = cVar33;
              auVar59[0x1f] = cVar33;
              auVar24 = vpand_avx2(auVar59,auVar24);
              auVar24 = vpaddsb_avx2(ZEXT132(bVar32),auVar24);
              alVar4[2]._4_4_ = uVar37;
              alVar4._0_20_ = in_stack_fffffffffffffbc0;
              alVar4[3]._0_4_ = uVar53;
              alVar4[3]._4_4_ = uVar75;
              parasail_memset___m256i(b_03,alVar4,CONCAT44(uVar75,uVar53));
              alVar5[2]._4_4_ = uVar37;
              alVar5._0_20_ = in_stack_fffffffffffffbc0;
              alVar5[3]._0_4_ = uVar53;
              alVar5[3]._4_4_ = uVar75;
              parasail_memset___m256i(b_04,alVar5,CONCAT44(uVar75,uVar53));
              alVar6[2]._4_4_ = uVar37;
              alVar6._0_20_ = in_stack_fffffffffffffbc0;
              alVar6[3]._0_4_ = uVar53;
              alVar6[3]._4_4_ = uVar75;
              parasail_memset___m256i(b_05,alVar6,CONCAT44(uVar75,uVar53));
              c[2]._4_4_ = uVar37;
              c._0_20_ = in_stack_fffffffffffffbc0;
              c[3]._0_4_ = uVar53;
              c[3]._4_4_ = uVar75;
              parasail_memset___m256i(b,c,CONCAT44(uVar75,uVar53));
              c_00[2]._4_4_ = uVar37;
              c_00._0_20_ = in_stack_fffffffffffffbc0;
              c_00[3]._0_4_ = uVar53;
              c_00[3]._4_4_ = uVar75;
              parasail_memset___m256i(b_00,c_00,CONCAT44(uVar75,uVar53));
              c_01[2]._4_4_ = uVar37;
              c_01._0_20_ = in_stack_fffffffffffffbc0;
              c_01[3]._0_4_ = uVar53;
              c_01[3]._4_4_ = uVar75;
              parasail_memset___m256i(b_01,c_01,CONCAT44(uVar75,uVar53));
              c_02[2]._4_4_ = uVar37;
              c_02._0_20_ = in_stack_fffffffffffffbc0;
              c_02[3]._0_4_ = uVar53;
              c_02[3]._4_4_ = uVar75;
              parasail_memset___m256i(b_02,c_02,CONCAT44(uVar75,uVar53));
              auVar26[1] = cVar56;
              auVar26[0] = cVar56;
              auVar26[2] = cVar56;
              auVar26[3] = cVar56;
              auVar26[4] = cVar56;
              auVar26[5] = cVar56;
              auVar26[6] = cVar56;
              auVar26[7] = cVar56;
              auVar26[8] = cVar56;
              auVar26[9] = cVar56;
              auVar26[10] = cVar56;
              auVar26[0xb] = cVar56;
              auVar26[0xc] = cVar56;
              auVar26[0xd] = cVar56;
              auVar26[0xe] = cVar56;
              auVar26[0xf] = cVar56;
              auVar26[0x10] = cVar56;
              auVar26[0x11] = cVar56;
              auVar26[0x12] = cVar56;
              auVar26[0x13] = cVar56;
              auVar26[0x14] = cVar56;
              auVar26[0x15] = cVar56;
              auVar26[0x16] = cVar56;
              auVar26[0x17] = cVar56;
              auVar26[0x18] = cVar56;
              auVar26[0x19] = cVar56;
              auVar26[0x1a] = cVar56;
              auVar26[0x1b] = cVar56;
              auVar26[0x1c] = cVar56;
              auVar26[0x1d] = cVar56;
              auVar26[0x1e] = cVar56;
              auVar26[0x1f] = cVar56;
              auVar63[1] = uVar55;
              auVar63[0] = uVar55;
              auVar63[2] = uVar55;
              auVar63[3] = uVar55;
              auVar63[4] = uVar55;
              auVar63[5] = uVar55;
              auVar63[6] = uVar55;
              auVar63[7] = uVar55;
              auVar63[8] = uVar55;
              auVar63[9] = uVar55;
              auVar63[10] = uVar55;
              auVar63[0xb] = uVar55;
              auVar63[0xc] = uVar55;
              auVar63[0xd] = uVar55;
              auVar63[0xe] = uVar55;
              auVar63[0xf] = uVar55;
              auVar63[0x10] = uVar55;
              auVar63[0x11] = uVar55;
              auVar63[0x12] = uVar55;
              auVar63[0x13] = uVar55;
              auVar63[0x14] = uVar55;
              auVar63[0x15] = uVar55;
              auVar63[0x16] = uVar55;
              auVar63[0x17] = uVar55;
              auVar63[0x18] = uVar55;
              auVar63[0x19] = uVar55;
              auVar63[0x1a] = uVar55;
              auVar63[0x1b] = uVar55;
              auVar63[0x1c] = uVar55;
              auVar63[0x1d] = uVar55;
              auVar63[0x1e] = uVar55;
              auVar63[0x1f] = uVar55;
              auVar58 = vpsubsb_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar63);
              uVar54 = (ulong)(uVar53 - 1);
              lVar40 = uVar54 << 5;
              auVar61[8] = 1;
              auVar61._0_8_ = 0x101010101010101;
              auVar61[9] = 1;
              auVar61[10] = 1;
              auVar61[0xb] = 1;
              auVar61[0xc] = 1;
              auVar61[0xd] = 1;
              auVar61[0xe] = 1;
              auVar61[0xf] = 1;
              auVar61[0x10] = 1;
              auVar61[0x11] = 1;
              auVar61[0x12] = 1;
              auVar61[0x13] = 1;
              auVar61[0x14] = 1;
              auVar61[0x15] = 1;
              auVar61[0x16] = 1;
              auVar61[0x17] = 1;
              auVar61[0x18] = 1;
              auVar61[0x19] = 1;
              auVar61[0x1a] = 1;
              auVar61[0x1b] = 1;
              auVar61[0x1c] = 1;
              auVar61[0x1d] = 1;
              auVar61[0x1e] = 1;
              auVar61[0x1f] = 1;
              auVar63 = auVar61;
              uVar41 = uVar53;
              do {
                *(undefined1 (*) [32])((long)*ptr_04 + lVar40) = auVar58;
                *(undefined1 (*) [32])((long)*ptr_05 + lVar40) = auVar63;
                auVar58 = vpsubsb_avx2(auVar58,auVar26);
                auVar63 = vpaddsb_avx2(auVar63,auVar61);
                lVar40 = lVar40 + -0x20;
                uVar42 = uVar41 - 1;
                bVar12 = 0 < (int)uVar41;
                uVar41 = uVar42;
              } while (uVar42 != 0 && bVar12);
              lVar40 = (long)iVar44;
              uVar47 = (ulong)uVar53;
              uVar48 = 0;
              do {
                lVar51 = 0;
                lVar45 = lVar40;
                do {
                  lVar50 = lVar45;
                  if (s1_beg != 0) {
                    lVar50 = 0;
                  }
                  if (lVar50 < -0x7f) {
                    lVar50 = -0x80;
                  }
                  *(char *)((long)&local_80 + lVar51) = (char)lVar50;
                  lVar51 = lVar51 + 1;
                  lVar45 = lVar45 - uVar47 * (uint)gap;
                } while (lVar51 != 0x20);
                palVar2 = ptr + uVar48;
                (*palVar2)[0] = local_80;
                (*palVar2)[1] = lStack_78;
                (*palVar2)[2] = lStack_70;
                (*palVar2)[3] = lStack_68;
                uVar48 = uVar48 + 1;
                lVar40 = lVar40 - (ulong)(uint)gap;
              } while (uVar48 != uVar47);
              *ptr_06 = '\0';
              uVar48 = 1;
              do {
                iVar34 = -0x80;
                if (-0x80 < iVar44) {
                  iVar34 = (int8_t)iVar44;
                }
                if (s2_beg != 0) {
                  iVar34 = '\0';
                }
                ptr_06[uVar48] = iVar34;
                uVar48 = uVar48 + 1;
                iVar44 = iVar44 - gap;
              } while (s2Len + 1 != uVar48);
              uVar48 = 1;
              if (1 < s2Len) {
                uVar48 = CONCAT44(0,s2Len);
              }
              lVar40 = (ulong)(uVar53 + (uVar53 == 0)) << 5;
              auVar13[1] = uVar57;
              auVar13[0] = uVar57;
              auVar13[2] = uVar57;
              auVar13[3] = uVar57;
              auVar13[4] = uVar57;
              auVar13[5] = uVar57;
              auVar13[6] = uVar57;
              auVar13[7] = uVar57;
              auVar13[8] = uVar57;
              auVar13[9] = uVar57;
              auVar13[10] = uVar57;
              auVar13[0xb] = uVar57;
              auVar13[0xc] = uVar57;
              auVar13[0xd] = uVar57;
              auVar13[0xe] = uVar57;
              auVar13[0xf] = uVar57;
              auVar13[0x10] = uVar57;
              auVar13[0x11] = uVar57;
              auVar13[0x12] = uVar57;
              auVar13[0x13] = uVar57;
              auVar13[0x14] = uVar57;
              auVar13[0x15] = uVar57;
              auVar13[0x16] = uVar57;
              auVar13[0x17] = uVar57;
              auVar13[0x18] = uVar57;
              auVar13[0x19] = uVar57;
              auVar13[0x1a] = uVar57;
              auVar13[0x1b] = uVar57;
              auVar13[0x1c] = uVar57;
              auVar13[0x1d] = uVar57;
              auVar13[0x1e] = uVar57;
              auVar13[0x1f] = uVar57;
              auVar63 = vpcmpeqb_avx2(auVar13,_DAT_008d4900);
              auVar14[1] = bVar32;
              auVar14[0] = bVar32;
              auVar14[2] = bVar32;
              auVar14[3] = bVar32;
              auVar14[4] = bVar32;
              auVar14[5] = bVar32;
              auVar14[6] = bVar32;
              auVar14[7] = bVar32;
              auVar14[8] = bVar32;
              auVar14[9] = bVar32;
              auVar14[10] = bVar32;
              auVar14[0xb] = bVar32;
              auVar14[0xc] = bVar32;
              auVar14[0xd] = bVar32;
              auVar14[0xe] = bVar32;
              auVar14[0xf] = bVar32;
              auVar14[0x10] = bVar32;
              auVar14[0x11] = bVar32;
              auVar14[0x12] = bVar32;
              auVar14[0x13] = bVar32;
              auVar14[0x14] = bVar32;
              auVar14[0x15] = bVar32;
              auVar14[0x16] = bVar32;
              auVar14[0x17] = bVar32;
              auVar14[0x18] = bVar32;
              auVar14[0x19] = bVar32;
              auVar14[0x1a] = bVar32;
              auVar14[0x1b] = bVar32;
              auVar14[0x1c] = bVar32;
              auVar14[0x1d] = bVar32;
              auVar14[0x1e] = bVar32;
              auVar14[0x1f] = bVar32;
              auVar72 = ZEXT3264(auVar14);
              auVar64 = ZEXT3264(auVar14);
              auVar65 = ZEXT3264(auVar14);
              auVar68 = ZEXT3264(auVar14);
              auVar69 = ZEXT3264(auVar14);
              auVar71 = ZEXT3264(CONCAT131(cVar31,CONCAT130(cVar31,CONCAT129(cVar31,CONCAT128(cVar31
                                                  ,CONCAT127(cVar31,CONCAT126(cVar31,CONCAT125(
                                                  cVar31,CONCAT124(cVar31,CONCAT123(cVar31,CONCAT122
                                                  (cVar31,CONCAT121(cVar31,CONCAT120(cVar31,
                                                  CONCAT119(cVar31,CONCAT118(cVar31,CONCAT117(cVar31
                                                  ,CONCAT116(cVar31,CONCAT115(cVar31,CONCAT114(
                                                  cVar31,CONCAT113(cVar31,CONCAT112(cVar31,CONCAT111
                                                  (cVar31,CONCAT110(cVar31,CONCAT19(cVar31,CONCAT18(
                                                  cVar31,CONCAT17(cVar31,CONCAT16(cVar31,CONCAT15(
                                                  cVar31,CONCAT14(cVar31,CONCAT13(cVar31,CONCAT12(
                                                  cVar31,CONCAT11(cVar31,cVar31)))))))))))))))))))))
                                                  )))))))))));
              uVar46 = 0;
              local_418 = iVar36;
              do {
                alVar4 = b_03[uVar54];
                alVar5 = b_04[uVar54];
                alVar6 = b_05[uVar54];
                auVar62 = SUB3216(ptr[uVar54],0);
                auVar67._0_16_ = ZEXT116(0) * auVar62 + ZEXT116(1) * alVar4._0_16_;
                auVar67._16_16_ = ZEXT116(0) * alVar4._16_16_ + ZEXT116(1) * auVar62;
                auVar58 = vpalignr_avx2((undefined1  [32])ptr[uVar54],auVar67,0xf);
                auVar26 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28);
                auVar16 = vpalignr_avx2((undefined1  [32])alVar4,auVar26,0xf);
                auVar26 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,0x28);
                auVar26 = vpalignr_avx2((undefined1  [32])alVar5,auVar26,0xf);
                auVar59 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,0x28);
                auVar62 = vpinsrb_avx(auVar58._0_16_,(uint)(byte)ptr_06[uVar46],0);
                auVar59 = vpalignr_avx2((undefined1  [32])alVar6,auVar59,0xf);
                auVar58 = vpblendd_avx2(auVar58,ZEXT1632(auVar62),0xf);
                lVar45 = uVar47 * (long)ppVar9->mapper[(byte)s2[uVar46]] * 0x20;
                auVar23[1] = bVar32;
                auVar23[0] = bVar32;
                auVar23[2] = bVar32;
                auVar23[3] = bVar32;
                auVar23[4] = bVar32;
                auVar23[5] = bVar32;
                auVar23[6] = bVar32;
                auVar23[7] = bVar32;
                auVar23[8] = bVar32;
                auVar23[9] = bVar32;
                auVar23[10] = bVar32;
                auVar23[0xb] = bVar32;
                auVar23[0xc] = bVar32;
                auVar23[0xd] = bVar32;
                auVar23[0xe] = bVar32;
                auVar23[0xf] = bVar32;
                auVar23[0x10] = bVar32;
                auVar23[0x11] = bVar32;
                auVar23[0x12] = bVar32;
                auVar23[0x13] = bVar32;
                auVar23[0x14] = bVar32;
                auVar23[0x15] = bVar32;
                auVar23[0x16] = bVar32;
                auVar23[0x17] = bVar32;
                auVar23[0x18] = bVar32;
                auVar23[0x19] = bVar32;
                auVar23[0x1a] = bVar32;
                auVar23[0x1b] = bVar32;
                auVar23[0x1c] = bVar32;
                auVar23[0x1d] = bVar32;
                auVar23[0x1e] = bVar32;
                auVar23[0x1f] = bVar32;
                auVar61 = vpsubsb_avx2(auVar23,(undefined1  [32])*ptr_04);
                auVar73 = ZEXT1664((undefined1  [16])0x0);
                lVar51 = 0;
                auVar74 = ZEXT1664((undefined1  [16])0x0);
                local_380 = ZEXT1632(ZEXT816(0));
                do {
                  auVar13 = vpaddsb_avx2(auVar58,*(undefined1 (*) [32])
                                                  ((long)pvVar8 + lVar51 + lVar45));
                  auVar14 = vpaddsb_avx2(auVar16,*(undefined1 (*) [32])
                                                  ((long)pvVar10 + lVar51 + lVar45));
                  auVar58 = *(undefined1 (*) [32])((long)*ptr + lVar51);
                  pVar3 = (unkbyte9 *)((long)*b_03 + lVar51);
                  uVar27 = *(undefined8 *)((long)pVar3 + 8);
                  uVar28 = *(undefined8 *)(pVar3 + 1);
                  uVar29 = *(undefined8 *)((long)pVar3 + 0x18);
                  uStack_277 = (undefined1)((ulong)uVar27 >> 8);
                  uStack_276 = (undefined1)((ulong)uVar27 >> 0x10);
                  uStack_275 = (undefined1)((ulong)uVar27 >> 0x18);
                  uStack_274 = (undefined1)((ulong)uVar27 >> 0x20);
                  uStack_273 = (undefined1)((ulong)uVar27 >> 0x28);
                  uStack_272 = (undefined1)((ulong)uVar27 >> 0x30);
                  uStack_271 = (undefined1)((ulong)uVar27 >> 0x38);
                  uStack_270 = (undefined1)uVar28;
                  uStack_26f = (undefined1)((ulong)uVar28 >> 8);
                  uStack_26e = (undefined1)((ulong)uVar28 >> 0x10);
                  uStack_26d = (undefined1)((ulong)uVar28 >> 0x18);
                  uStack_26c = (undefined1)((ulong)uVar28 >> 0x20);
                  uStack_26b = (undefined1)((ulong)uVar28 >> 0x28);
                  uStack_26a = (undefined1)((ulong)uVar28 >> 0x30);
                  uStack_269 = (undefined1)((ulong)uVar28 >> 0x38);
                  uStack_268 = (undefined1)uVar29;
                  uStack_267 = (undefined1)((ulong)uVar29 >> 8);
                  uStack_266 = (undefined1)((ulong)uVar29 >> 0x10);
                  uStack_265 = (undefined1)((ulong)uVar29 >> 0x18);
                  uStack_264 = (undefined1)((ulong)uVar29 >> 0x20);
                  uStack_263 = (undefined1)((ulong)uVar29 >> 0x28);
                  uStack_262 = (undefined1)((ulong)uVar29 >> 0x30);
                  uStack_261 = (undefined1)((ulong)uVar29 >> 0x38);
                  auVar67 = vpaddsb_avx2(auVar26,*(undefined1 (*) [32])
                                                  ((long)pvVar11 + lVar51 + lVar45));
                  auVar26 = *(undefined1 (*) [32])((long)*b_04 + lVar51);
                  auVar61 = vpaddsb_avx2(auVar61,*(undefined1 (*) [32])((long)*ptr_04 + lVar51));
                  auVar22[8] = 1;
                  auVar22._0_8_ = 0x101010101010101;
                  auVar22[9] = 1;
                  auVar22[10] = 1;
                  auVar22[0xb] = 1;
                  auVar22[0xc] = 1;
                  auVar22[0xd] = 1;
                  auVar22[0xe] = 1;
                  auVar22[0xf] = 1;
                  auVar22[0x10] = 1;
                  auVar22[0x11] = 1;
                  auVar22[0x12] = 1;
                  auVar22[0x13] = 1;
                  auVar22[0x14] = 1;
                  auVar22[0x15] = 1;
                  auVar22[0x16] = 1;
                  auVar22[0x17] = 1;
                  auVar22[0x18] = 1;
                  auVar22[0x19] = 1;
                  auVar22[0x1a] = 1;
                  auVar22[0x1b] = 1;
                  auVar22[0x1c] = 1;
                  auVar22[0x1d] = 1;
                  auVar22[0x1e] = 1;
                  auVar22[0x1f] = 1;
                  auVar15 = vpaddsb_avx2(auVar22,auVar59);
                  auVar59 = *(undefined1 (*) [32])((long)*b_05 + lVar51);
                  auVar21 = vpcmpgtb_avx2(auVar61,auVar23);
                  local_380 = vpblendvb_avx2(local_380,local_2a0,auVar21);
                  auVar18 = vpblendvb_avx2(auVar74._0_32_,local_360,auVar21);
                  auVar16 = vpaddsb_avx2(local_340,*(undefined1 (*) [32])((long)*ptr_05 + lVar51));
                  auVar19 = vpblendvb_avx2(auVar73._0_32_,auVar16,auVar21);
                  auVar25[1] = uVar55;
                  auVar25[0] = uVar55;
                  auVar25[2] = uVar55;
                  auVar25[3] = uVar55;
                  auVar25[4] = uVar55;
                  auVar25[5] = uVar55;
                  auVar25[6] = uVar55;
                  auVar25[7] = uVar55;
                  auVar25[8] = uVar55;
                  auVar25[9] = uVar55;
                  auVar25[10] = uVar55;
                  auVar25[0xb] = uVar55;
                  auVar25[0xc] = uVar55;
                  auVar25[0xd] = uVar55;
                  auVar25[0xe] = uVar55;
                  auVar25[0xf] = uVar55;
                  auVar25[0x10] = uVar55;
                  auVar25[0x11] = uVar55;
                  auVar25[0x12] = uVar55;
                  auVar25[0x13] = uVar55;
                  auVar25[0x14] = uVar55;
                  auVar25[0x15] = uVar55;
                  auVar25[0x16] = uVar55;
                  auVar25[0x17] = uVar55;
                  auVar25[0x18] = uVar55;
                  auVar25[0x19] = uVar55;
                  auVar25[0x1a] = uVar55;
                  auVar25[0x1b] = uVar55;
                  auVar25[0x1c] = uVar55;
                  auVar25[0x1d] = uVar55;
                  auVar25[0x1e] = uVar55;
                  auVar25[0x1f] = uVar55;
                  auVar16 = vpsubsb_avx2(auVar58,auVar25);
                  auVar21[1] = cVar56;
                  auVar21[0] = cVar56;
                  auVar21[2] = cVar56;
                  auVar21[3] = cVar56;
                  auVar21[4] = cVar56;
                  auVar21[5] = cVar56;
                  auVar21[6] = cVar56;
                  auVar21[7] = cVar56;
                  auVar21[8] = cVar56;
                  auVar21[9] = cVar56;
                  auVar21[10] = cVar56;
                  auVar21[0xb] = cVar56;
                  auVar21[0xc] = cVar56;
                  auVar21[0xd] = cVar56;
                  auVar21[0xe] = cVar56;
                  auVar21[0xf] = cVar56;
                  auVar21[0x10] = cVar56;
                  auVar21[0x11] = cVar56;
                  auVar21[0x12] = cVar56;
                  auVar21[0x13] = cVar56;
                  auVar21[0x14] = cVar56;
                  auVar21[0x15] = cVar56;
                  auVar21[0x16] = cVar56;
                  auVar21[0x17] = cVar56;
                  auVar21[0x18] = cVar56;
                  auVar21[0x19] = cVar56;
                  auVar21[0x1a] = cVar56;
                  auVar21[0x1b] = cVar56;
                  auVar21[0x1c] = cVar56;
                  auVar21[0x1d] = cVar56;
                  auVar21[0x1e] = cVar56;
                  auVar21[0x1f] = cVar56;
                  auVar25 = vpsubsb_avx2(*(undefined1 (*) [32])((long)*b + lVar51),auVar21);
                  auVar21 = vpcmpgtb_avx2(auVar16,auVar25);
                  auVar60 = vpmaxsb_avx2(auVar16,auVar25);
                  auVar16[9] = uStack_277;
                  auVar16._0_9_ = *pVar3;
                  auVar16[10] = uStack_276;
                  auVar16[0xb] = uStack_275;
                  auVar16[0xc] = uStack_274;
                  auVar16[0xd] = uStack_273;
                  auVar16[0xe] = uStack_272;
                  auVar16[0xf] = uStack_271;
                  auVar16[0x10] = uStack_270;
                  auVar16[0x11] = uStack_26f;
                  auVar16[0x12] = uStack_26e;
                  auVar16[0x13] = uStack_26d;
                  auVar16[0x14] = uStack_26c;
                  auVar16[0x15] = uStack_26b;
                  auVar16[0x16] = uStack_26a;
                  auVar16[0x17] = uStack_269;
                  auVar16[0x18] = uStack_268;
                  auVar16[0x19] = uStack_267;
                  auVar16[0x1a] = uStack_266;
                  auVar16[0x1b] = uStack_265;
                  auVar16[0x1c] = uStack_264;
                  auVar16[0x1d] = uStack_263;
                  auVar16[0x1e] = uStack_262;
                  auVar16[0x1f] = uStack_261;
                  auVar25 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar51),auVar16,
                                           auVar21);
                  auVar20 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar51),auVar26,
                                           auVar21);
                  auVar21 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar51),auVar59,
                                           auVar21);
                  auVar21 = vpaddsb_avx2(auVar21,auVar22);
                  auVar22 = vpcmpgtb_avx2(auVar60,auVar13);
                  *(undefined1 (*) [32])((long)*b + lVar51) = auVar60;
                  *(undefined1 (*) [32])((long)*b_00 + lVar51) = auVar25;
                  local_2a0 = vpblendvb_avx2(auVar14,auVar25,auVar22);
                  *(undefined1 (*) [32])((long)*b_01 + lVar51) = auVar20;
                  local_360 = vpblendvb_avx2(auVar67,auVar20,auVar22);
                  local_340 = vpblendvb_avx2(auVar15,auVar21,auVar22);
                  *(undefined1 (*) [32])((long)*b_02 + lVar51) = auVar21;
                  auVar73 = ZEXT3264(auVar19);
                  auVar74 = ZEXT3264(auVar18);
                  auVar23 = vpmaxsb_avx2(auVar23,auVar61);
                  auVar61 = vpmaxsb_avx2(auVar60,auVar13);
                  *(undefined1 (*) [32])((long)*ptr + lVar51) = auVar13;
                  *(undefined1 (*) [32])((long)*b_03 + lVar51) = auVar14;
                  *(undefined1 (*) [32])((long)*b_04 + lVar51) = auVar67;
                  *(undefined1 (*) [32])((long)*b_05 + lVar51) = auVar15;
                  lVar51 = lVar51 + 0x20;
                } while (lVar40 != lVar51);
                auVar20[1] = uVar55;
                auVar20[0] = uVar55;
                auVar20[2] = uVar55;
                auVar20[3] = uVar55;
                auVar20[4] = uVar55;
                auVar20[5] = uVar55;
                auVar20[6] = uVar55;
                auVar20[7] = uVar55;
                auVar20[8] = uVar55;
                auVar20[9] = uVar55;
                auVar20[10] = uVar55;
                auVar20[0xb] = uVar55;
                auVar20[0xc] = uVar55;
                auVar20[0xd] = uVar55;
                auVar20[0xe] = uVar55;
                auVar20[0xf] = uVar55;
                auVar20[0x10] = uVar55;
                auVar20[0x11] = uVar55;
                auVar20[0x12] = uVar55;
                auVar20[0x13] = uVar55;
                auVar20[0x14] = uVar55;
                auVar20[0x15] = uVar55;
                auVar20[0x16] = uVar55;
                auVar20[0x17] = uVar55;
                auVar20[0x18] = uVar55;
                auVar20[0x19] = uVar55;
                auVar20[0x1a] = uVar55;
                auVar20[0x1b] = uVar55;
                auVar20[0x1c] = uVar55;
                auVar20[0x1d] = uVar55;
                auVar20[0x1e] = uVar55;
                auVar20[0x1f] = uVar55;
                auVar60._0_16_ = ZEXT116(0) * auVar61._0_16_ + ZEXT116(1) * auVar15._0_16_;
                auVar60._16_16_ = ZEXT116(0) * auVar15._16_16_ + ZEXT116(1) * auVar61._0_16_;
                auVar58 = vpalignr_avx2(auVar61,auVar60,0xf);
                auVar26 = vperm2i128_avx2(local_2a0,local_2a0,8);
                local_2a0 = vpalignr_avx2(local_2a0,auVar26,0xf);
                auVar26 = vperm2i128_avx2(local_360,local_360,8);
                local_360 = vpalignr_avx2(local_360,auVar26,0xf);
                auVar26 = vperm2i128_avx2(local_340,local_340,8);
                auVar62 = vpinsrb_avx(auVar58._0_16_,(uint)(byte)ptr_06[uVar46 + 1],0);
                local_340 = vpalignr_avx2(local_340,auVar26,0xf);
                auVar14 = vpblendd_avx2(auVar58,ZEXT1632(auVar62),0xf);
                auVar58 = vpaddsb_avx2(auVar14,(undefined1  [32])*ptr_04);
                auVar61 = vpcmpgtb_avx2(auVar23,auVar58);
                auVar13 = vpmaxsb_avx2(auVar23,auVar58);
                auVar26 = vpblendvb_avx2(local_2a0,local_380,auVar61);
                auVar59 = vpblendvb_avx2(local_360,auVar18,auVar61);
                auVar58 = vpaddsb_avx2(local_340,(undefined1  [32])*ptr_05);
                uVar1 = uVar46 + 1;
                auVar58 = vpblendvb_avx2(auVar58,auVar19,auVar61);
                iVar44 = 0x1e;
                do {
                  auVar16 = vperm2i128_avx2(auVar58,auVar58,0x28);
                  auVar67 = vperm2i128_avx2(auVar59,auVar59,0x28);
                  auVar23 = vperm2i128_avx2(auVar26,auVar26,0x28);
                  auVar61 = vperm2i128_avx2(auVar13,auVar13,0x28);
                  auVar61 = vpalignr_avx2(auVar13,auVar61,0xf);
                  auVar61 = vpaddsb_avx2(auVar24,auVar61);
                  auVar23 = vpalignr_avx2(auVar26,auVar23,0xf);
                  auVar67 = vpalignr_avx2(auVar59,auVar67,0xf);
                  auVar16 = vpalignr_avx2(auVar58,auVar16,0xf);
                  auVar16 = vpaddsb_avx2(auVar17,auVar16);
                  auVar15 = vpcmpgtb_avx2(auVar13,auVar61);
                  auVar26 = vpblendvb_avx2(auVar23,auVar26,auVar15);
                  auVar59 = vpblendvb_avx2(auVar67,auVar59,auVar15);
                  auVar13 = vpmaxsb_avx2(auVar13,auVar61);
                  auVar58 = vpblendvb_avx2(auVar16,auVar58,auVar15);
                  iVar44 = iVar44 + -1;
                } while (iVar44 != 0);
                auVar61 = vperm2i128_avx2(auVar13,auVar13,0x28);
                auVar61 = vpalignr_avx2(auVar13,auVar61,0xf);
                auVar13 = vperm2i128_avx2(auVar26,auVar26,0x28);
                auVar13 = vpalignr_avx2(auVar26,auVar13,0xf);
                auVar26 = vperm2i128_avx2(auVar59,auVar59,0x28);
                auVar59 = vpalignr_avx2(auVar59,auVar26,0xf);
                auVar26 = vperm2i128_avx2(auVar58,auVar58,0x28);
                auVar26 = vpalignr_avx2(auVar58,auVar26,0xf);
                auVar58 = vpaddsb_avx2(auVar61,ZEXT132(bVar32));
                auVar61 = vpcmpgtb_avx2(auVar58,auVar14);
                auVar23 = vpblendvb_avx2(local_2a0,auVar13,auVar61);
                auVar16 = vpblendvb_avx2(local_360,auVar59,auVar61);
                auVar14 = vpmaxsb_avx2(auVar58,auVar14);
                auVar61 = vpblendvb_avx2(local_340,auVar26,auVar61);
                lVar45 = 0;
                auVar71 = ZEXT3264(auVar71._0_32_);
                auVar72 = ZEXT3264(auVar72._0_32_);
                auVar15[8] = 1;
                auVar15._0_8_ = 0x101010101010101;
                auVar15[9] = 1;
                auVar15[10] = 1;
                auVar15[0xb] = 1;
                auVar15[0xc] = 1;
                auVar15[0xd] = 1;
                auVar15[0xe] = 1;
                auVar15[0xf] = 1;
                auVar15[0x10] = 1;
                auVar15[0x11] = 1;
                auVar15[0x12] = 1;
                auVar15[0x13] = 1;
                auVar15[0x14] = 1;
                auVar15[0x15] = 1;
                auVar15[0x16] = 1;
                auVar15[0x17] = 1;
                auVar15[0x18] = 1;
                auVar15[0x19] = 1;
                auVar15[0x1a] = 1;
                auVar15[0x1b] = 1;
                auVar15[0x1c] = 1;
                auVar15[0x1d] = 1;
                auVar15[0x1e] = 1;
                auVar15[0x1f] = 1;
                do {
                  auVar67 = *(undefined1 (*) [32])((long)*ptr + lVar45);
                  auVar14 = vpsubsb_avx2(auVar14,auVar20);
                  auVar18[1] = cVar56;
                  auVar18[0] = cVar56;
                  auVar18[2] = cVar56;
                  auVar18[3] = cVar56;
                  auVar18[4] = cVar56;
                  auVar18[5] = cVar56;
                  auVar18[6] = cVar56;
                  auVar18[7] = cVar56;
                  auVar18[8] = cVar56;
                  auVar18[9] = cVar56;
                  auVar18[10] = cVar56;
                  auVar18[0xb] = cVar56;
                  auVar18[0xc] = cVar56;
                  auVar18[0xd] = cVar56;
                  auVar18[0xe] = cVar56;
                  auVar18[0xf] = cVar56;
                  auVar18[0x10] = cVar56;
                  auVar18[0x11] = cVar56;
                  auVar18[0x12] = cVar56;
                  auVar18[0x13] = cVar56;
                  auVar18[0x14] = cVar56;
                  auVar18[0x15] = cVar56;
                  auVar18[0x16] = cVar56;
                  auVar18[0x17] = cVar56;
                  auVar18[0x18] = cVar56;
                  auVar18[0x19] = cVar56;
                  auVar18[0x1a] = cVar56;
                  auVar18[0x1b] = cVar56;
                  auVar18[0x1c] = cVar56;
                  auVar18[0x1d] = cVar56;
                  auVar18[0x1e] = cVar56;
                  auVar18[0x1f] = cVar56;
                  auVar21 = vpsubsb_avx2(auVar58,auVar18);
                  auVar58 = vpcmpgtb_avx2(auVar14,auVar21);
                  auVar13 = vpblendvb_avx2(auVar13,auVar23,auVar58);
                  auVar59 = vpblendvb_avx2(auVar59,auVar16,auVar58);
                  auVar26 = vpblendvb_avx2(auVar26,auVar61,auVar58);
                  auVar58 = vpmaxsb_avx2(auVar14,auVar21);
                  auVar61 = vpmaxsb_avx2(auVar67,*(undefined1 (*) [32])((long)*b + lVar45));
                  auVar14 = vpmaxsb_avx2(auVar61,auVar58);
                  auVar21 = vpcmpgtb_avx2(auVar61,auVar58);
                  auVar61 = vpblendvb_avx2(auVar13,*(undefined1 (*) [32])((long)*b_00 + lVar45),
                                           auVar21);
                  auVar67 = vpcmpeqb_avx2(auVar14,auVar67);
                  auVar23 = vpblendvb_avx2(auVar61,*(undefined1 (*) [32])((long)*b_03 + lVar45),
                                           auVar67);
                  auVar61 = vpblendvb_avx2(auVar59,*(undefined1 (*) [32])((long)*b_01 + lVar45),
                                           auVar21);
                  auVar16 = vpblendvb_avx2(auVar61,*(undefined1 (*) [32])((long)*b_04 + lVar45),
                                           auVar67);
                  auVar26 = vpaddsb_avx2(auVar15,auVar26);
                  auVar61 = vpblendvb_avx2(auVar26,*(undefined1 (*) [32])((long)*b_02 + lVar45),
                                           auVar21);
                  auVar61 = vpblendvb_avx2(auVar61,*(undefined1 (*) [32])((long)*b_05 + lVar45),
                                           auVar67);
                  *(undefined1 (*) [32])((long)*ptr + lVar45) = auVar14;
                  *(undefined1 (*) [32])((long)*b_03 + lVar45) = auVar23;
                  *(undefined1 (*) [32])((long)*b_04 + lVar45) = auVar16;
                  *(undefined1 (*) [32])((long)*b_05 + lVar45) = auVar61;
                  auVar18 = vpminsb_avx2(auVar71._0_32_,auVar14);
                  auVar71 = ZEXT3264(auVar18);
                  auVar67 = vpmaxsb_avx2(auVar72._0_32_,auVar14);
                  auVar67 = vpmaxsb_avx2(auVar67,auVar23);
                  auVar21 = vpmaxsb_avx2(auVar16,auVar61);
                  auVar67 = vpmaxsb_avx2(auVar67,auVar21);
                  auVar72 = ZEXT3264(auVar67);
                  lVar45 = lVar45 + 0x20;
                } while (lVar40 != lVar45);
                auVar26 = vpcmpgtb_avx2((undefined1  [32])ptr[uVar52],auVar69._0_32_);
                auVar58 = vpblendvb_avx2(auVar68._0_32_,(undefined1  [32])b_03[uVar52],auVar26);
                cVar33 = auVar58[0x17];
                auVar68 = ZEXT3264(auVar58);
                auVar58 = vpblendvb_avx2(auVar65._0_32_,(undefined1  [32])b_04[uVar52],auVar26);
                cVar66 = auVar58[0x17];
                auVar65 = ZEXT3264(auVar58);
                auVar58 = vpblendvb_avx2(auVar64._0_32_,(undefined1  [32])b_05[uVar52],auVar26);
                local_380[0] = auVar58[0x17];
                auVar64 = ZEXT3264(auVar58);
                auVar58 = vpmaxsb_avx2(auVar69._0_32_,(undefined1  [32])ptr[uVar52]);
                bVar70 = auVar58[0x17];
                auVar69 = ZEXT3264(auVar58);
                auVar58 = vpand_avx2(auVar26,auVar63);
                if ((((((((((((((((((((((((((((((((auVar58 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar58 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar58 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar58 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar58 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar58 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar58 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar58 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar58 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar58 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar58 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar58 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar58 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar58 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar58 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar58 >> 0x7f,0) != '\0') ||
                                  (auVar58 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar58 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar58 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar58 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar58 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar58 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar58 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar58 >> 0xbf,0) != '\0') ||
                          (auVar58 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar58 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar58 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar58 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar58 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar58 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar58 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar58[0x1f] < '\0') {
                  local_418 = (int)uVar46;
                }
                uVar46 = uVar1;
              } while (uVar1 != uVar48);
              if (s2_end == 0) {
                cVar33 = '\0';
                local_360[0] = '\0';
                local_380[0] = '\0';
              }
              else {
                if (iVar35 < 0x1f) {
                  iVar44 = 1;
                  if (1 < iVar39) {
                    iVar44 = iVar39;
                  }
                  do {
                    auVar63 = auVar69._0_32_;
                    auVar24 = vperm2i128_avx2(auVar63,auVar63,8);
                    auVar24 = vpalignr_avx2(auVar63,auVar24,0xf);
                    bVar70 = auVar24[0x17];
                    auVar69 = ZEXT3264(auVar24);
                    auVar63 = auVar68._0_32_;
                    auVar24 = vperm2i128_avx2(auVar63,auVar63,8);
                    auVar24 = vpalignr_avx2(auVar63,auVar24,0xf);
                    cVar33 = auVar24[0x17];
                    auVar68 = ZEXT3264(auVar24);
                    auVar63 = auVar65._0_32_;
                    auVar24 = vperm2i128_avx2(auVar63,auVar63,8);
                    auVar24 = vpalignr_avx2(auVar63,auVar24,0xf);
                    cVar66 = auVar24[0x17];
                    auVar65 = ZEXT3264(auVar24);
                    auVar63 = auVar64._0_32_;
                    auVar24 = vperm2i128_avx2(auVar63,auVar63,8);
                    auVar24 = vpalignr_avx2(auVar63,auVar24,0xf);
                    local_380[0] = auVar24[0x17];
                    auVar64 = ZEXT3264(auVar24);
                    iVar44 = iVar44 + -1;
                  } while (iVar44 != 0);
                }
                uVar37 = (uint)bVar70;
                local_360[0] = cVar66;
              }
              cVar56 = (char)uVar37;
              iVar44 = iVar43;
              if ((s1_end != 0) && (((ulong)uVar7 + 0x1f & 0x7fffffe0) != 0)) {
                uVar54 = 0;
                do {
                  iVar49 = ((uint)uVar54 & 0x1f) * uVar53 + ((uint)(uVar54 >> 5) & 0x7ffffff);
                  if (iVar49 < (int)uVar7) {
                    bVar70 = *(byte *)((long)*ptr + uVar54);
                    iVar30 = iVar36;
                    uVar41 = (uint)bVar70;
                    if (((char)(byte)uVar37 < (char)bVar70) ||
                       (((bVar70 == (byte)uVar37 && (local_418 == iVar36)) &&
                        (iVar30 = local_418, uVar41 = uVar37, iVar49 < iVar44)))) {
                      uVar37 = uVar41;
                      local_418 = iVar30;
                      cVar33 = *(char *)((long)*b_03 + uVar54);
                      local_360[0] = *(char *)((long)*b_04 + uVar54);
                      local_380[0] = *(char *)((long)*b_05 + uVar54);
                      iVar44 = iVar49;
                    }
                  }
                  cVar56 = (char)uVar37;
                  uVar54 = uVar54 + 1;
                } while ((uVar53 & 0x3ffffff) << 5 != (int)uVar54);
              }
              if (s2_end == 0 && s1_end == 0) {
                cVar56 = SUB321(ptr[uVar52],0x17);
                auVar69 = ZEXT3264((undefined1  [32])ptr[uVar52]);
                cVar33 = SUB321(b_03[uVar52],0x17);
                auVar68 = ZEXT3264((undefined1  [32])b_03[uVar52]);
                local_360[0] = SUB321(b_04[uVar52],0x17);
                auVar65 = ZEXT3264((undefined1  [32])b_04[uVar52]);
                local_380[0] = SUB321(b_05[uVar52],0x17);
                auVar64 = ZEXT3264((undefined1  [32])b_05[uVar52]);
                local_418 = iVar36;
                iVar44 = iVar43;
                if (iVar35 < 0x1f) {
                  iVar35 = 1;
                  if (1 < iVar39) {
                    iVar35 = iVar39;
                  }
                  do {
                    auVar63 = auVar69._0_32_;
                    auVar24 = vperm2i128_avx2(auVar63,auVar63,0x28);
                    auVar24 = vpalignr_avx2(auVar63,auVar24,0xf);
                    cVar56 = auVar24[0x17];
                    auVar69 = ZEXT3264(auVar24);
                    auVar63 = auVar68._0_32_;
                    auVar24 = vperm2i128_avx2(auVar63,auVar63,0x28);
                    auVar24 = vpalignr_avx2(auVar63,auVar24,0xf);
                    cVar33 = auVar24[0x17];
                    auVar68 = ZEXT3264(auVar24);
                    auVar63 = auVar65._0_32_;
                    auVar24 = vperm2i128_avx2(auVar63,auVar63,0x28);
                    auVar24 = vpalignr_avx2(auVar63,auVar24,0xf);
                    local_360[0] = auVar24[0x17];
                    auVar65 = ZEXT3264(auVar24);
                    auVar63 = auVar64._0_32_;
                    auVar24 = vperm2i128_avx2(auVar63,auVar63,0x28);
                    auVar24 = vpalignr_avx2(auVar63,auVar24,0xf);
                    local_380[0] = auVar24[0x17];
                    auVar64 = ZEXT3264(auVar24);
                    iVar35 = iVar35 + -1;
                  } while (iVar35 != 0);
                }
              }
              auVar24[1] = bVar32;
              auVar24[0] = bVar32;
              auVar24[2] = bVar32;
              auVar24[3] = bVar32;
              auVar24[4] = bVar32;
              auVar24[5] = bVar32;
              auVar24[6] = bVar32;
              auVar24[7] = bVar32;
              auVar24[8] = bVar32;
              auVar24[9] = bVar32;
              auVar24[10] = bVar32;
              auVar24[0xb] = bVar32;
              auVar24[0xc] = bVar32;
              auVar24[0xd] = bVar32;
              auVar24[0xe] = bVar32;
              auVar24[0xf] = bVar32;
              auVar24[0x10] = bVar32;
              auVar24[0x11] = bVar32;
              auVar24[0x12] = bVar32;
              auVar24[0x13] = bVar32;
              auVar24[0x14] = bVar32;
              auVar24[0x15] = bVar32;
              auVar24[0x16] = bVar32;
              auVar24[0x17] = bVar32;
              auVar24[0x18] = bVar32;
              auVar24[0x19] = bVar32;
              auVar24[0x1a] = bVar32;
              auVar24[0x1b] = bVar32;
              auVar24[0x1c] = bVar32;
              auVar24[0x1d] = bVar32;
              auVar24[0x1e] = bVar32;
              auVar24[0x1f] = bVar32;
              auVar24 = vpcmpgtb_avx2(auVar24,auVar18);
              auVar17[1] = cVar31;
              auVar17[0] = cVar31;
              auVar17[2] = cVar31;
              auVar17[3] = cVar31;
              auVar17[4] = cVar31;
              auVar17[5] = cVar31;
              auVar17[6] = cVar31;
              auVar17[7] = cVar31;
              auVar17[8] = cVar31;
              auVar17[9] = cVar31;
              auVar17[10] = cVar31;
              auVar17[0xb] = cVar31;
              auVar17[0xc] = cVar31;
              auVar17[0xd] = cVar31;
              auVar17[0xe] = cVar31;
              auVar17[0xf] = cVar31;
              auVar17[0x10] = cVar31;
              auVar17[0x11] = cVar31;
              auVar17[0x12] = cVar31;
              auVar17[0x13] = cVar31;
              auVar17[0x14] = cVar31;
              auVar17[0x15] = cVar31;
              auVar17[0x16] = cVar31;
              auVar17[0x17] = cVar31;
              auVar17[0x18] = cVar31;
              auVar17[0x19] = cVar31;
              auVar17[0x1a] = cVar31;
              auVar17[0x1b] = cVar31;
              auVar17[0x1c] = cVar31;
              auVar17[0x1d] = cVar31;
              auVar17[0x1e] = cVar31;
              auVar17[0x1f] = cVar31;
              auVar63 = vpcmpgtb_avx2(auVar67,auVar17);
              auVar24 = vpor_avx2(auVar63,auVar24);
              if ((((((((((((((((((((((((((((((((auVar24 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar24 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar24 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar24 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar24 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar24 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar24 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar24 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar24 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar24 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar24 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar24 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar24 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar24 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar24 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar24 >> 0x7f,0) != '\0') ||
                                (auVar24 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar24 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar24 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar24 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar24 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar24 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar24 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar24 >> 0xbf,0) != '\0') ||
                        (auVar24 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar24 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar24 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar24 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar24 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar24 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar24 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar24[0x1f] < '\0') {
                *(byte *)&ppVar38->flag = (byte)ppVar38->flag | 0x40;
                cVar56 = '\0';
                cVar33 = '\0';
                local_360[0] = '\0';
                local_380[0] = '\0';
                local_418 = 0;
                iVar44 = 0;
              }
              ppVar38->score = (int)cVar56;
              ppVar38->end_query = iVar44;
              ppVar38->end_ref = local_418;
              *(int *)(ppVar38->field_4).extra = (int)cVar33;
              ((ppVar38->field_4).stats)->similar = (int)local_360[0];
              ((ppVar38->field_4).stats)->length = (int)local_380[0];
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar38;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile8.score;
    pvPm = (__m256i*)profile->profile8.matches;
    pvPs = (__m256i*)profile->profile8.similar;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi8(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi8(_mm256_set1_epi8(position),
            _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31));
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi8(segLen), 1);
    vNegInfFront = _mm256_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi8(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi8(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi8(vGapper, vGapE);
            vGapperL = _mm256_adds_epi8(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 1);
        vHpM = _mm256_slli_si256_rpl(vHpM, 1);
        vHpS = _mm256_slli_si256_rpl(vHpS, 1);
        vHpL = _mm256_slli_si256_rpl(vHpL, 1);
        vHp = _mm256_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi8(vH, vGapO);
            vE_ext = _mm256_subs_epi8(vE, vGapE);
            case1 = _mm256_cmpgt_epi8(vE_opn, vE_ext);
            vE = _mm256_max_epi8(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi8(vEL, vOne);
            vGapper = _mm256_adds_epi8(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi8(vF, vGapper),
                    _mm256_cmpeq_epi8(vF, vGapper));
            vF = _mm256_max_epi8(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi8(vHp, vW);
            vHpM = _mm256_adds_epi8(vHpM, vWM);
            vHpS = _mm256_adds_epi8(vHpS, vWS);
            vHpL = _mm256_adds_epi8(vHpL, vOne);
            case1 = _mm256_cmpgt_epi8(vE, vHp);
            vHt = _mm256_max_epi8(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 1);
        vHtM = _mm256_slli_si256_rpl(vHtM, 1);
        vHtS = _mm256_slli_si256_rpl(vHtS, 1);
        vHtL = _mm256_slli_si256_rpl(vHtL, 1);
        vHt = _mm256_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi8(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi8(vGapper, vF),
                _mm256_cmpeq_epi8(vGapper, vF));
        vF = _mm256_max_epi8(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi8(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 1);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 1);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 1);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 1);
            vFt = _mm256_adds_epi8(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi8(vFt, vF),
                    _mm256_cmpeq_epi8(vFt, vF));
            vF = _mm256_max_epi8(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi8(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 1);
        vFM = _mm256_slli_si256_rpl(vFM, 1);
        vFS = _mm256_slli_si256_rpl(vFS, 1);
        vFL = _mm256_slli_si256_rpl(vFL, 1);
        vF = _mm256_adds_epi8(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi8(vF, vHt);
        vH = _mm256_max_epi8(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi8(vH, vGapO);
            vF_ext = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi8(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi8(vFL, vOne);
            vH = _mm256_max_epi8(vHp, vE);
            vH = _mm256_max_epi8(vH, vF);
            case1 = _mm256_cmpeq_epi8(vH, vHp);
            case2 = _mm256_cmpeq_epi8(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            cond_max = _mm256_cmpgt_epi8(vH, vMaxH);
            vMaxH = _mm256_max_epi8(vMaxH, vH);
            vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
                vHM = _mm256_slli_si256_rpl(vHM, 1);
                vHS = _mm256_slli_si256_rpl(vHS, 1);
                vHL = _mm256_slli_si256_rpl(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
            result->stats->rowcols->matches_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHM, 31);
            result->stats->rowcols->similar_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHS, 31);
            result->stats->rowcols->length_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHL, 31);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 1);
            vMaxM = _mm256_slli_si256_rpl(vMaxM, 1);
            vMaxS = _mm256_slli_si256_rpl(vMaxS, 1);
            vMaxL = _mm256_slli_si256_rpl(vMaxL, 1);
        }
        end_query = s1Len-1;
        score = (int8_t) _mm256_extract_epi8_rpl(vMaxH, 31);
        matches = (int8_t) _mm256_extract_epi8_rpl(vMaxM, 31);
        similar = (int8_t) _mm256_extract_epi8_rpl(vMaxS, 31);
        length = (int8_t) _mm256_extract_epi8_rpl(vMaxL, 31);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvH;
        int8_t *m = (int8_t*)pvHM;
        int8_t *s = (int8_t*)pvHS;
        int8_t *l = (int8_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 1);
            vHM = _mm256_slli_si256_rpl(vHM, 1);
            vHS = _mm256_slli_si256_rpl(vHS, 1);
            vHL = _mm256_slli_si256_rpl(vHL, 1);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        matches = (int8_t) _mm256_extract_epi8_rpl (vHM, 31);
        similar = (int8_t) _mm256_extract_epi8_rpl (vHS, 31);
        length = (int8_t) _mm256_extract_epi8_rpl (vHL, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}